

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PortConnection * __thiscall
slang::BumpAllocator::emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&,bool>
          (BumpAllocator *this,PortSymbol *args,bool *args_1)

{
  PortConnection *this_00;
  byte *in_RDX;
  Symbol *in_RSI;
  BumpAllocator *in_RDI;
  
  this_00 = (PortConnection *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::PortConnection::PortConnection(this_00,in_RSI,(bool)(*in_RDX & 1));
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }